

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

tokens __thiscall
Scanner<UTF8EncodingPolicyBase<false>>::ScanStringConstant<false,false>
          (Scanner<UTF8EncodingPolicyBase<false>> *this,OLECHAR delim,EncodedCharPtr *pp)

{
  byte *pbVar1;
  byte *pbVar2;
  Scanner<UTF8EncodingPolicyBase<false>> SVar3;
  byte *end;
  undefined8 *puVar4;
  code *pcVar5;
  bool bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  IdentPtr pIVar9;
  char16 cVar10;
  int iVar11;
  uint uVar12;
  char16 local_4a;
  HRESULT local_48;
  uint uStack_44;
  OLECHAR lower;
  byte *pbStack_40;
  int wT;
  EncodedCharPtr p;
  OLECHAR ch;
  
  pbStack_40 = *pp;
  end = *(byte **)(this + 0x4c8);
  this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)this[0x508] & 0xf3);
  *(undefined4 *)(this + 0x51c) = 0;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00f16d2f:
  do {
    pbVar1 = pbStack_40 + 1;
    if (pbStack_40 < end) {
      p._6_2_ = (char16)*pbStack_40;
    }
    else {
      p._6_2_ = L'\0';
    }
    if ((ushort)p._6_2_ < 0x22) {
      if (p._6_2_ == L'\0') {
        if (end < pbVar1) goto LAB_00f172da;
      }
      else {
        if ((p._6_2_ == L'\n') || (p._6_2_ == L'\r')) {
LAB_00f172da:
          *(byte **)(this + 0x4e0) = pbStack_40;
          pbStack_40 = pbVar1;
          Scanner<UTF8EncodingPolicyBase<false>_>::Error
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,-0x7ff5fc09);
        }
LAB_00f16dbc:
        if (0x7f < (ushort)p._6_2_) {
          pbStack_40 = pbVar1;
          p._6_2_ = utf8::DecodeTail(p._6_2_,&stack0xffffffffffffffc0,end,
                                     (DecodeOptions *)(this + 0x10),(bool *)0x0);
          *(byte **)(this + 8) = pbStack_40 + (*(long *)(this + 8) - (long)pbVar1);
          pbVar1 = pbStack_40;
        }
      }
    }
    else if ((p._6_2_ == L'\"') || (p._6_2_ == L'\'')) {
      if (p._6_2_ == delim) {
        if ((((byte)this[0x508] & 0x40) == 0) ||
           ((*(int *)(this + 0x51c) == 10 &&
            (**(undefined1 (**) [16])(this + 0x520) == _DAT_011c5b00 &&
             ZEXT416(*(uint *)(*(undefined1 (**) [16])(this + 0x520))[1]) == _DAT_011c5af0)))) {
          puVar4 = *(undefined8 **)(this + 0x4b8);
          pbStack_40 = pbVar1;
          pIVar9 = HashTbl::PidHashNameLen<char16_t>
                             ((HashTbl *)(this + 0x20),*(char16_t **)(this + 0x520),
                              *(uint32 *)(this + 0x51c));
          *puVar4 = pIVar9;
          puVar4[1] = 0;
        }
        else {
          **(undefined1 (**) [16])(this + 0x4b8) = (undefined1  [16])0x0;
          pbStack_40 = pbVar1;
        }
        *(undefined4 *)(this + 0x744) = 0;
        this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)
                      ((byte)this[0x508] & 0xfd | (delim == L'\"') * '\x02');
        *pp = pbStack_40;
        return tkStrCon;
      }
    }
    else {
      if (p._6_2_ != L'\\') goto LAB_00f16dbc;
      SVar3 = this[0x508];
      this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)SVar3 | 8);
      pbVar2 = pbStack_40 + 2;
      if (pbVar1 < end) {
        p._6_2_ = (char16)*pbVar1;
      }
      else {
        p._6_2_ = L'\0';
      }
      pbVar1 = pbVar2;
      if ((ushort)p._6_2_ < 0x62) {
        if ((ushort)p._6_2_ < 0x30) {
          if (p._6_2_ == L'\0') {
            if (end <= pbVar2) {
              local_48 = -0x7ff5fc09;
              p._6_2_ = L'\0';
              pbStack_40 = pbVar2;
              goto LAB_00f1730a;
            }
            goto LAB_00f16e00;
          }
          pbStack_40 = pbVar2;
          if ((p._6_2_ != L'\n') && (p._6_2_ != L'\r')) goto switchD_00f16e77_caseD_6f;
LAB_00f16e3a:
          *(byte **)(this + 0x4e0) = pbStack_40;
          Scanner<UTF8EncodingPolicyBase<false>_>::ScanNewLine
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,(uint)(ushort)p._6_2_);
          pbStack_40 = *(byte **)(this + 0x4e0);
          goto LAB_00f16d2f;
        }
        cVar10 = (char16)((ushort)p._6_2_ - 0x30);
        if ((ushort)p._6_2_ - 0x30 < 4) {
          pbStack_40 = pbStack_40 + 3;
          uStack_44 = 0xffffffd0;
          if (pbVar2 < end) {
            uStack_44 = *pbVar2 - 0x30;
          }
          if ((uStack_44 & 0xffff) < 8) {
            this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)SVar3 | 0xc);
            p._6_2_ = (short)uStack_44 + cVar10 * 8;
            goto LAB_00f16f71;
          }
          if ((cVar10 != L'\0') || (p._6_2_ = cVar10, (uStack_44 & 0xffff) < 10)) {
            this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)SVar3 | 0xc);
            p._6_2_ = cVar10;
          }
        }
        else {
          if (3 < (ushort)p._6_2_ - 0x34) goto switchD_00f16e77_caseD_6f;
          this[0x508] = (Scanner<UTF8EncodingPolicyBase<false>>)((byte)SVar3 | 0xc);
          pbStack_40 = pbVar2;
          p._6_2_ = cVar10;
LAB_00f16f71:
          pbVar1 = pbStack_40 + 1;
          uStack_44 = 0xffffffd0;
          if (pbStack_40 < end) {
            uStack_44 = *pbStack_40 - 0x30;
          }
          pbStack_40 = pbVar1;
          if ((uStack_44 & 0xfff8) == 0) {
            p._6_2_ = (short)uStack_44 + p._6_2_ * 8;
            goto LAB_00f16e00;
          }
        }
        pbVar1 = pbStack_40 + -1;
      }
      else {
        switch(p._6_2_) {
        case L'n':
          p._6_2_ = L'\n';
          break;
        case L'o':
        case L'p':
        case L'q':
        case L's':
        case L'w':
switchD_00f16e77_caseD_6f:
          if (0x7f < (ushort)p._6_2_) {
            pbStack_40 = pbVar2;
            p._6_2_ = utf8::DecodeTail(p._6_2_,&stack0xffffffffffffffc0,end,
                                       (DecodeOptions *)(this + 0x10),(bool *)0x0);
            *(byte **)(this + 8) = pbStack_40 + (*(long *)(this + 8) - (long)pbVar2);
            pbVar1 = pbStack_40;
            if ((p._6_2_ & 0xfffeU) == 0x2028) goto LAB_00f16e3a;
          }
          break;
        case L'r':
          p._6_2_ = L'\r';
          break;
        case L't':
          p._6_2_ = L'\t';
          break;
        case L'u':
          p._6_2_ = L'\0';
          pbStack_40 = pbStack_40 + 3;
          if (pbVar2 < end) {
            cVar10 = (char16)*pbVar2;
          }
          else {
            cVar10 = L'\0';
          }
          BVar7 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&stack0xffffffffffffffbc);
          uVar12 = uStack_44;
          if (BVar7 == 0) {
            if ((cVar10 == L'{') && (this[0x509] == (Scanner<UTF8EncodingPolicyBase<false>>)0x1)) {
              if (pbStack_40 < end) {
                cVar10 = (char16)*pbStack_40;
              }
              else {
                cVar10 = L'\0';
              }
              local_48 = -0x7ff5fc01;
              pbStack_40 = pbStack_40 + 1;
              BVar7 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&stack0xffffffffffffffbc);
              uVar12 = uStack_44;
              if (BVar7 == 0) goto LAB_00f1730a;
              while( true ) {
                if (pbStack_40 < end) {
                  cVar10 = (char16)*pbStack_40;
                }
                else {
                  cVar10 = L'\0';
                }
                pbStack_40 = pbStack_40 + 1;
                BVar7 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&stack0xffffffffffffffbc);
                if (BVar7 == 0) break;
                uVar12 = uVar12 * 0x10 + uStack_44;
                if (0x10ffff < uVar12) {
                  local_48 = -0x7ff5fbd9;
                  goto LAB_00f1730a;
                }
              }
              if (cVar10 != L'}') {
                local_48 = -0x7ff5fbd8;
                goto LAB_00f1730a;
              }
              if (0x10ffff < uVar12) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar8 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                                   ,0x4bd,"(codePoint <= 0x10FFFF)","codePoint <= 0x10FFFF");
                if (!bVar6) {
                  pcVar5 = (code *)invalidInstructionException();
                  (*pcVar5)();
                }
                *puVar8 = 0;
              }
              if (0xffff < uVar12) {
                local_4a = L'\0';
                Js::NumberUtilities::CodePointAsSurrogatePair
                          (uVar12,&local_4a,(char16 *)((long)&p + 6));
                Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
                          ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)local_4a);
                pbVar1 = pbStack_40;
                break;
              }
              goto LAB_00f17119;
            }
          }
          else {
            if (pbStack_40 < end) {
              cVar10 = (char16)*pbStack_40;
            }
            else {
              cVar10 = L'\0';
            }
            pbStack_40 = pbStack_40 + 1;
            BVar7 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&stack0xffffffffffffffbc);
            if (BVar7 != 0) {
              iVar11 = uStack_44 * 0x100 + uVar12 * 0x1000;
              goto LAB_00f17093;
            }
          }
LAB_00f172fa:
          local_48 = -0x7ff5fc01;
LAB_00f1730a:
          *(byte **)(this + 0x4e0) = pbStack_40 + -1;
          Scanner<UTF8EncodingPolicyBase<false>_>::Error
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)this,local_48);
        case L'v':
          p._6_2_ = L'\v';
          break;
        case L'x':
          p._6_2_ = L'\0';
          iVar11 = 0;
          pbStack_40 = pbVar2;
LAB_00f17093:
          if (pbStack_40 < end) {
            cVar10 = (char16)*pbStack_40;
          }
          else {
            cVar10 = L'\0';
          }
          pbStack_40 = pbStack_40 + 1;
          BVar7 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&stack0xffffffffffffffbc);
          uVar12 = uStack_44;
          if (BVar7 == 0) goto LAB_00f172fa;
          if (pbStack_40 < end) {
            cVar10 = (char16)*pbStack_40;
          }
          else {
            cVar10 = L'\0';
          }
          local_48 = -0x7ff5fc01;
          pbStack_40 = pbStack_40 + 1;
          BVar7 = Js::NumberUtilities::FHexDigit(cVar10,(int *)&stack0xffffffffffffffbc);
          if ((BVar7 == 0) || (uVar12 = uVar12 * 0x10 + iVar11 + uStack_44, 0xffff < uVar12))
          goto LAB_00f1730a;
LAB_00f17119:
          p._6_2_ = (char16)uVar12;
          pbVar1 = pbStack_40;
          break;
        default:
          if (p._6_2_ == L'f') {
            p._6_2_ = L'\f';
          }
          else {
            if (p._6_2_ != L'b') goto switchD_00f16e77_caseD_6f;
            p._6_2_ = L'\b';
          }
        }
      }
    }
LAB_00f16e00:
    pbStack_40 = pbVar1;
    Scanner<UTF8EncodingPolicyBase<false>_>::TemporaryBuffer::AppendCh<true>
              ((TemporaryBuffer *)(this + 0x510),(uint)(ushort)p._6_2_);
  } while( true );
}

Assistant:

tokens Scanner<EncodingPolicy>::ScanStringConstant(OLECHAR delim, EncodedCharPtr *pp)
{
    static_assert((stringTemplateMode && createRawString) || (!stringTemplateMode && !createRawString), "stringTemplateMode and createRawString must have the same value");

    OLECHAR ch, c, rawch;
    int wT;
    EncodedCharPtr p = *pp;
    EncodedCharPtr last = m_pchLast;

    // Reset
    m_OctOrLeadingZeroOnLastTKNumber = false;
    m_EscapeOnLastTkStrCon = FALSE;

    m_tempChBuf.Reset();

    // Use template parameter to gate raw string creation.
    // If createRawString is false, all these operations should be no-ops
    if (createRawString)
    {
        m_tempChBufSecondary.Reset();
    }

    for (;;)
    {
        switch ((rawch = ch = this->ReadFirst(p, last)))
        {
        case kchRET:
            if (stringTemplateMode)
            {
                if (this->PeekFirst(p, last) == kchNWL)
                {
                    // Eat the <LF> char, ignore return
                    this->ReadFirst(p, last);
                }

                // Both <CR> and <CR><LF> are normalized to <LF> in template cooked and raw values
                ch = rawch = kchNWL;
            }

            // Fall through
        case kchNWL:
            if (stringTemplateMode)
            {
                // Notify the scanner to update current line, number of lines etc
                NotifyScannedNewLine();

                // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                m_pchMinLine = p;

                break;
            }

            m_currentCharacter = p - 1;
            Error(ERRnoStrEnd);

        case '"':
        case '\'':
            if (ch == delim)
                goto LBreak;
            break;

        case '`':
            // In string template scan mode, don't consume the '`' - we need to differentiate
            // between a closed string template and the expression open sequence - ${
            if (stringTemplateMode)
            {
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case '$':
            // If we are parsing a string literal part of a string template, ${ indicates we need to switch
            // to parsing an expression.
            if (stringTemplateMode && this->PeekFirst(p, last) == '{')
            {
                // Rewind to the $ and return
                p--;
                goto LBreak;
            }

            // If we aren't scanning for a string template, do the default thing
            goto LMainDefault;

        case kchNUL:
            if (p > last)
            {
                m_currentCharacter = p - 1;
                Error(ERRnoStrEnd);
            }
            break;

        default:
LMainDefault:
            if (this->IsMultiUnitChar(ch))
            {
                rawch = ch = this->template ReadRest<true>(ch, p, last);
            }
            break;

        case kchBSL:
            // In raw mode '\\' is not an escape character, just add the char into the raw buffer.
            m_tempChBufSecondary.template AppendCh<createRawString>(ch);

            m_EscapeOnLastTkStrCon=TRUE;

            // In raw mode, we append the raw char itself and not the escaped value so save the char.
            rawch = ch = this->ReadFirst(p, last);
            codepoint_t codePoint = 0;
            uint errorType = (uint)ERRbadHexDigit;
            switch (ch)
            {
            case 'b':
                ch = 0x08;
                break;
            case 't':
                ch = 0x09;
                break;
            case 'v':
                ch = 0x0B; //Only in ES5 mode
                break; //same as default
            case 'n':
                ch = 0x0A;
                break;
            case 'f':
                ch = 0x0C;
                break;
            case 'r':
                ch = 0x0D;
                break;
            case 'x':
                // Insert the 'x' here before jumping to parse the hex digits.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                // 2 hex digits
                ch = 0;
                goto LTwoHex;
            case 'u':
                // Raw string just inserts a 'u' here.
                m_tempChBufSecondary.template AppendCh<createRawString>(ch);

                ch = 0;
                if (Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto LFourHex;
                else if (c != '{' || !this->es6UnicodeMode)
                    goto ReturnScanError;

                Assert(c == '{');
                // c should definitely be a '{' which should be appended to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                //At least one digit is expected
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    goto ReturnScanError;
                }

                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint = static_cast<codepoint_t>(wT);

                while(Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                {
                    m_tempChBufSecondary.template AppendCh<createRawString>(c);
                    codePoint <<= 4;
                    codePoint += static_cast<codepoint_t>(wT);

                    if (codePoint > 0x10FFFF)
                    {
                        errorType = (uint)ERRInvalidCodePoint;
                        goto ReturnScanError;
                    }
                }

                if (c != '}')
                {
                    errorType = (uint)ERRMissingCurlyBrace;
                    goto ReturnScanError;
                }

                Assert(codePoint <= 0x10FFFF);

                if (codePoint >= 0x10000)
                {
                    OLECHAR lower = 0;
                    Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &lower, &ch);
                    m_tempChBuf.AppendCh(lower);
                }
                else
                {
                    ch = (char16)codePoint;
                }

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                break;
LFourHex:
                codePoint = 0x0;
                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x1000);
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append fourth (or second) hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0100);

LTwoHex:
                // This code path doesn't expect curly.
                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                // Append first hex digit character to the raw string.
                m_tempChBufSecondary.template AppendCh<createRawString>(c);

                codePoint += static_cast<codepoint_t>(wT * 0x0010);

                if (!Js::NumberUtilities::FHexDigit(c = this->ReadFirst(p, last), &wT))
                    goto ReturnScanError;

                codePoint += static_cast<codepoint_t>(wT);

                // In raw mode we want the last hex character or the closing curly. c should hold one or the other.
                if (createRawString)
                    rawch = c;

                if (codePoint < 0x10000)
                {
                    ch = static_cast<OLECHAR>(codePoint);
                }
                else
                {
                    goto ReturnScanError;
                }
                break;
            case '0':
            case '1':
            case '2':
            case '3':
                // 1 to 3 octal digits

                ch -= '0';

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    c = this->PeekFirst(p, last);
                    if (ch != 0 || (c >= '0' && c <= '7'))
                    {
                        errorType = (uint)ERRES5NoOctal;
                        goto ReturnScanError;
                    }
                    break;
                }

                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    if (ch != 0 || ((char16)wT <= 9))
                    {
                        m_OctOrLeadingZeroOnLastTKNumber = true;
                    }
                    p--;
                    break;
                }

                m_OctOrLeadingZeroOnLastTKNumber = true;
                ch = static_cast< OLECHAR >(ch * 8 + wT);
                goto LOneOctal;
            case '4':
            case '5':
            case '6':
            case '7':
                // 1 to 2 octal digits

                // Octal escape sequences are not allowed inside string template literals
                if (stringTemplateMode)
                {
                    errorType = (uint)ERRES5NoOctal;
                    goto ReturnScanError;
                }

                ch -= '0';

                m_OctOrLeadingZeroOnLastTKNumber = true;

LOneOctal:
                wT = (c = this->ReadFirst(p, last)) - '0';
                if ((char16)wT > 7)
                {
                    p--;
                    break;
                }

                ch = static_cast< OLECHAR >(ch * 8 + wT);
                break;

            case kchRET:        // 0xD
                if (stringTemplateMode)
                {
                    // If this is \<CR><LF> we can eat the <LF> right now
                    if (this->PeekFirst(p, last) == kchNWL)
                    {
                        // Eat the <LF> char, ignore return
                        this->ReadFirst(p, last);
                    }

                    // Both \<CR> and \<CR><LF> are normalized to \<LF> in template raw string
                    rawch = kchNWL;
                }
            case kchLS:         // 0x2028, classifies as new line
            case kchPS:         // 0x2029, classifies as new line
            case kchNWL:        // 0xA
LEcmaEscapeLineBreak:
                if (stringTemplateMode)
                {
                    // We're going to ignore the line continuation tokens for the cooked strings, but we need to append the token for raw strings
                    m_tempChBufSecondary.template AppendCh<createRawString>(rawch);

                    // Template literal strings ignore all escaped line continuation tokens
                    NotifyScannedNewLine();

                    // We haven't updated m_currentCharacter yet, so make sure the MinLine info is correct in case we error out.
                    m_pchMinLine = p;

                    continue;
                }

                m_currentCharacter = p;
                ScanNewLine(ch);
                p = m_currentCharacter;
                continue;

            case 0:
                if (p >= last)
                {
                    errorType = (uint)ERRnoStrEnd;

ReturnScanError:
                    m_currentCharacter = p - 1;
                    Error(errorType);
                }
                else if (stringTemplateMode)
                {
                    // Escaped null character is translated into 0x0030 for raw template literals
                    rawch = 0x0030;
                }
                break;

            default:
                if (this->IsMultiUnitChar(ch))
                {
                    rawch = ch = this->template ReadRest<true>(ch, p, last);
                    switch (ch)
                    {
                    case kchLS:
                    case kchPS:
                        goto LEcmaEscapeLineBreak;
                    }
                }
                break;
            }
            break;
        }

        m_tempChBuf.AppendCh(ch);
        m_tempChBufSecondary.template AppendCh<createRawString>(rawch);
    }

LBreak:
    bool createPid = true;

    if ((m_DeferredParseFlags & ScanFlagSuppressStrPid) != 0)
    {
        createPid = false;

        if ((m_tempChBuf.m_ichCur == 10) && (0 == memcmp(_u("use strict"), m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur * sizeof(OLECHAR))))
        {
            createPid = true;
        }
    }

    if (createPid)
    {
        m_ptoken->SetIdentifier(this->GetHashTbl()->PidHashNameLen(m_tempChBuf.m_prgch, m_tempChBuf.m_ichCur));
    }
    else
    {
        m_ptoken->SetIdentifier(NULL);
    }

    m_scanState = ScanStateNormal;
    m_doubleQuoteOnLastTkStrCon = '"' == delim;
    *pp = p;

    return tkStrCon;
}